

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_cfg.cpp
# Opt level: O0

MPP_RET mpp_dec_cfg_get_ptr(MppDecCfg cfg,char *name,void **val)

{
  MPP_RET MVar1;
  MppDecCfgService *this;
  MppTrieInfo *info_00;
  MppCfgInfo *node_00;
  char *pcVar2;
  char *pcVar3;
  MPP_RET ret;
  MppCfgInfo *info;
  MppTrieInfo *node;
  MppDecCfgImpl *p;
  void **val_local;
  char *name_local;
  MppDecCfg cfg_local;
  
  if ((cfg == (MppDecCfg)0x0) || (name == (char *)0x0)) {
    _mpp_log_l(2,"mpp_dec_cfg","invalid input cfg %p name %p\n","mpp_dec_cfg_get_ptr",cfg,name);
    cfg_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    this = MppDecCfgService::get();
    info_00 = MppDecCfgService::get_info(this,name);
    node_00 = (MppCfgInfo *)mpp_trie_info_ctx(info_00);
    MVar1 = check_cfg_info(node_00,name,CFG_FUNC_TYPE_Ptr,"mpp_dec_cfg_get_ptr");
    if (MVar1 == MPP_OK) {
      if ((mpp_dec_cfg_debug & 4) != 0) {
        pcVar2 = mpp_trie_info_name(info_00);
        pcVar3 = strof_cfg_type(node_00->data_type);
        _mpp_log_l(4,"mpp_dec_cfg","name %s type %s\n","mpp_dec_cfg_get_ptr",pcVar2,pcVar3);
      }
      cfg_local._4_4_ = mpp_cfg_get_ptr(node_00,(void *)((long)cfg + 8),val);
    }
    else {
      cfg_local._4_4_ = MPP_NOK;
    }
  }
  return cfg_local._4_4_;
}

Assistant:

void mpp_dec_cfg_show(void)
{
    MppDecCfgService *srv = MppDecCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}